

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

int X509_STORE_CTX_get1_issuer(X509 **issuer,X509_STORE_CTX *ctx,X509 *x)

{
  anon_union_8_4_ca12f507_for_data a;
  int iVar1;
  size_t sVar2;
  X509_OBJECT *a_00;
  X509_NAME *b;
  ulong local_58;
  size_t i;
  int ret;
  int idx;
  X509_OBJECT *pobj;
  X509_OBJECT obj;
  X509_NAME *xn;
  X509 *x_local;
  X509_STORE_CTX *ctx_local;
  X509 **out_issuer_local;
  
  obj.data.x509 = (X509 *)X509_get_issuer_name(x);
  iVar1 = X509_STORE_CTX_get_by_subject
                    ((X509_STORE_CTX *)ctx,1,(X509_NAME *)obj.data.x509,(X509_OBJECT *)&pobj);
  if (iVar1 == 0) {
    out_issuer_local._4_4_ = 0;
  }
  else {
    iVar1 = x509_check_issued_with_callback((X509_STORE_CTX *)ctx,(X509 *)x,(X509 *)obj._0_8_);
    if (iVar1 == 0) {
      X509_OBJECT_free_contents((X509_OBJECT *)&pobj);
      i._0_4_ = 0;
      CRYPTO_MUTEX_lock_write((CRYPTO_MUTEX *)&ctx->ctx->objs);
      iVar1 = X509_OBJECT_idx_by_subject
                        (*(stack_st_X509_OBJECT **)ctx->ctx,1,(X509_NAME *)obj.data.x509);
      if (iVar1 != -1) {
        local_58 = (ulong)iVar1;
        while( true ) {
          sVar2 = sk_X509_OBJECT_num(*(stack_st_X509_OBJECT **)ctx->ctx);
          if ((sVar2 <= local_58) ||
             (a_00 = (X509_OBJECT *)
                     sk_X509_OBJECT_value(*(stack_st_X509_OBJECT **)ctx->ctx,local_58), a = obj.data
             , a_00->type != 1)) goto LAB_00234793;
          b = X509_get_subject_name((a_00->data).x509);
          iVar1 = X509_NAME_cmp((X509_NAME *)a.x509,b);
          if (iVar1 != 0) goto LAB_00234793;
          iVar1 = x509_check_issued_with_callback
                            ((X509_STORE_CTX *)ctx,(X509 *)x,(X509 *)(a_00->data).x509);
          if (iVar1 != 0) break;
          local_58 = local_58 + 1;
        }
        *issuer = (X509 *)a_00->data;
        X509_OBJECT_up_ref_count(a_00);
        i._0_4_ = 1;
      }
LAB_00234793:
      CRYPTO_MUTEX_unlock_write((CRYPTO_MUTEX *)&ctx->ctx->objs);
      out_issuer_local._4_4_ = (int)i;
    }
    else {
      *issuer = (X509 *)obj._0_8_;
      out_issuer_local._4_4_ = 1;
    }
  }
  return out_issuer_local._4_4_;
}

Assistant:

int X509_STORE_CTX_get1_issuer(X509 **out_issuer, X509_STORE_CTX *ctx,
                               X509 *x) {
  X509_NAME *xn;
  X509_OBJECT obj, *pobj;
  int idx, ret;
  size_t i;
  xn = X509_get_issuer_name(x);
  if (!X509_STORE_CTX_get_by_subject(ctx, X509_LU_X509, xn, &obj)) {
    return 0;
  }
  // If certificate matches all OK
  if (x509_check_issued_with_callback(ctx, x, obj.data.x509)) {
    *out_issuer = obj.data.x509;
    return 1;
  }
  X509_OBJECT_free_contents(&obj);

  // Else find index of first cert accepted by
  // |x509_check_issued_with_callback|.
  ret = 0;
  CRYPTO_MUTEX_lock_write(&ctx->ctx->objs_lock);
  idx = X509_OBJECT_idx_by_subject(ctx->ctx->objs, X509_LU_X509, xn);
  if (idx != -1) {  // should be true as we've had at least one
                    // match
    // Look through all matching certs for suitable issuer
    for (i = idx; i < sk_X509_OBJECT_num(ctx->ctx->objs); i++) {
      pobj = sk_X509_OBJECT_value(ctx->ctx->objs, i);
      // See if we've run past the matches
      if (pobj->type != X509_LU_X509) {
        break;
      }
      if (X509_NAME_cmp(xn, X509_get_subject_name(pobj->data.x509))) {
        break;
      }
      if (x509_check_issued_with_callback(ctx, x, pobj->data.x509)) {
        *out_issuer = pobj->data.x509;
        X509_OBJECT_up_ref_count(pobj);
        ret = 1;
        break;
      }
    }
  }
  CRYPTO_MUTEX_unlock_write(&ctx->ctx->objs_lock);
  return ret;
}